

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_duplicateIdBehaviour_Test::~Annotator_duplicateIdBehaviour_Test
          (Annotator_duplicateIdBehaviour_Test *this)

{
  Annotator_duplicateIdBehaviour_Test *this_local;
  
  ~Annotator_duplicateIdBehaviour_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}